

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_data_blocked_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  int iVar1;
  uint8_t **in_RSI;
  long in_RDI;
  int ret;
  quicly_data_blocked_frame_t frame;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint8_t *in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  local_4 = quicly_decode_data_blocked_frame
                      (in_RSI,in_stack_ffffffffffffffe0,
                       (quicly_data_blocked_frame_t *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    quicly_maxsender_request_transmit((quicly_maxsender_t *)(in_RDI + 0x558));
    iVar1 = should_send_max_data((quicly_conn_t *)0x148138);
    if (iVar1 != 0) {
      *(undefined8 *)(in_RDI + 0x730) = 0;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int handle_data_blocked_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_data_blocked_frame_t frame;
    int ret;

    if ((ret = quicly_decode_data_blocked_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(DATA_BLOCKED_RECEIVE, conn, conn->stash.now, frame.offset);

    quicly_maxsender_request_transmit(&conn->ingress.max_data.sender);
    if (should_send_max_data(conn))
        conn->egress.send_ack_at = 0;

    return 0;
}